

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

size_t __thiscall
Assimp::ColladaParser::ReadPrimitives
          (ColladaParser *this,Mesh *pMesh,
          vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
          *pPerIndexChannels,size_t pNumPrimitives,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *pVCount,PrimitiveType pPrimType)

{
  pointer *ppuVar1;
  byte bVar2;
  pointer pIVar3;
  pointer puVar4;
  size_t __n;
  iterator __position;
  int iVar5;
  InputChannel *channel;
  pointer pIVar6;
  pointer puVar7;
  byte *pbVar8;
  Accessor *pAVar9;
  Data *pDVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  ulong numOffsets;
  size_t currentVertex;
  long lVar14;
  size_t sVar15;
  size_t perVertexOffset;
  ulong uVar16;
  ColladaParser *this_00;
  InputChannel *input;
  size_t currentPrimitive;
  size_t numPoints;
  ulong local_98;
  vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_> *local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  undefined8 local_70;
  string local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_38;
  
  pIVar6 = (pPerIndexChannels->
           super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pIVar3 = (pPerIndexChannels->
           super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar6 == pIVar3) {
    perVertexOffset = 0xffffffffffffffff;
    numOffsets = 1;
  }
  else {
    numOffsets = 1;
    perVertexOffset = 0xffffffffffffffff;
    do {
      uVar16 = pIVar6->mOffset + 1;
      if (uVar16 < numOffsets) {
        uVar16 = numOffsets;
      }
      numOffsets = uVar16;
      if (pIVar6->mType == IT_Vertex) {
        perVertexOffset = pIVar6->mOffset;
      }
      pIVar6 = pIVar6 + 1;
    } while (pIVar6 != pIVar3);
  }
  if (pPrimType == Prim_Lines) {
    lVar14 = pNumPrimitives * 2;
  }
  else if (pPrimType == Prim_Triangles) {
    lVar14 = pNumPrimitives * 3;
  }
  else {
    if (pPrimType == Prim_Polylist) {
      puVar7 = (pVCount->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (pVCount->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar7 != puVar4) {
        lVar14 = 0;
        do {
          lVar14 = lVar14 + *puVar7;
          puVar7 = puVar7 + 1;
        } while (puVar7 != puVar4);
        goto LAB_0043a6bc;
      }
    }
    lVar14 = 0;
  }
LAB_0043a6bc:
  indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = this;
  local_98 = pNumPrimitives;
  local_90 = pPerIndexChannels;
  __range2 = pVCount;
  if (lVar14 != 0) {
    this_00 = (ColladaParser *)&indices;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,lVar14 * numOffsets)
    ;
  }
  if (local_98 != 0) {
    this_00 = this;
    pbVar8 = (byte *)GetTextContent(this);
    bVar2 = *pbVar8;
    while (bVar2 != 0) {
      pbVar8 = pbVar8 + ((bVar2 - 0x2b & 0xfd) == 0);
      bVar11 = *pbVar8;
      if ((byte)(bVar11 - 0x3a) < 0xf6) {
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        do {
          uVar13 = (uint)(byte)(bVar11 - 0x30) + uVar13 * 10;
          bVar11 = pbVar8[1];
          pbVar8 = pbVar8 + 1;
        } while (0xf5 < (byte)(bVar11 - 0x3a));
      }
      uVar12 = -uVar13;
      if (bVar2 != 0x2d) {
        uVar12 = uVar13;
      }
      if ((int)uVar12 < 1) {
        uVar12 = 0;
      }
      local_60._M_dataplus._M_p = (pointer)(ulong)uVar12;
      this_00 = (ColladaParser *)&indices;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
                 (unsigned_long *)&local_60);
      while (((ulong)*pbVar8 < 0x21 && ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0))) {
        pbVar8 = pbVar8 + 1;
      }
      bVar2 = *pbVar8;
    }
  }
  if (lVar14 != 0) {
    if ((long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != lVar14 * numOffsets) {
      if (pPrimType != Prim_Lines) {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"Expected different index count in <p> element.","");
        ThrowException(this,&local_60);
      }
      ReportWarning(this_00,"Expected different index count in <p> element, %zu instead of %zu.");
      local_98 = (ulong)((long)indices.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)indices.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) / numOffsets >> 1;
      goto LAB_0043a830;
    }
    if (lVar14 != 0) goto LAB_0043a830;
  }
  if ((ulong)((long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) % numOffsets != 0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Expected different index count in <p> element.","");
    ThrowException(this,&local_60);
  }
LAB_0043a830:
  pIVar6 = (pMesh->mPerVertexData).
           super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pIVar6 != (pMesh->mPerVertexData).
                super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (pIVar6->mResolved == (Accessor *)0x0) {
        pAVar9 = ResolveLibraryReference<Assimp::Collada::Accessor>
                           (this,&this->mAccessorLibrary,&pIVar6->mAccessor);
        pIVar6->mResolved = pAVar9;
        if (pAVar9->mData == (Data *)0x0) {
          pDVar10 = ResolveLibraryReference<Assimp::Collada::Data>
                              (this,&this->mDataLibrary,&pAVar9->mSource);
          pAVar9->mData = pDVar10;
        }
      }
      pIVar6 = pIVar6 + 1;
    } while (pIVar6 != (pMesh->mPerVertexData).
                       super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pIVar6 = (local_90->
           super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pIVar6 != (local_90->
                super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (pIVar6->mResolved == (Accessor *)0x0) {
        if (pIVar6->mType == IT_Vertex) {
          __n = (pIVar6->mAccessor)._M_string_length;
          if ((__n != (pMesh->mVertexID)._M_string_length) ||
             ((__n != 0 &&
              (iVar5 = bcmp((pIVar6->mAccessor)._M_dataplus._M_p,(pMesh->mVertexID)._M_dataplus._M_p
                            ,__n), iVar5 != 0)))) {
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_60,"Unsupported vertex referencing scheme.","");
            ThrowException(this,&local_60);
          }
        }
        else {
          pAVar9 = ResolveLibraryReference<Assimp::Collada::Accessor>
                             (this,&this->mAccessorLibrary,&pIVar6->mAccessor);
          pIVar6->mResolved = pAVar9;
          if (pAVar9->mData == (Data *)0x0) {
            pDVar10 = ResolveLibraryReference<Assimp::Collada::Data>
                                (this,&this->mDataLibrary,&pAVar9->mSource);
            pAVar9->mData = pDVar10;
          }
        }
      }
      pIVar6 = pIVar6 + 1;
    } while (pIVar6 != (local_90->
                       super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((pPrimType & ~Prim_LineStrip) == Prim_TriFans) {
    local_98 = 1;
  }
  if (pPrimType == Prim_TriStrips) {
    local_98 = (ulong)((long)indices.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)indices.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) / numOffsets - 2;
  }
  if (pPrimType == Prim_LineStrip) {
    local_98 = (ulong)((long)indices.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)indices.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) / numOffsets - 1;
  }
  local_38 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&pMesh->mFaceSize;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,local_98);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&pMesh->mFacePosIndices,
             (ulong)((long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) / numOffsets);
  if (local_98 != 0) {
    currentPrimitive = 0;
    local_70 = 0;
    do {
      numPoints = 0;
      switch(pPrimType) {
      case Prim_Lines:
        numPoints = 2;
        sVar15 = 0;
        do {
          CopyVertex(this,sVar15,numOffsets,numPoints,perVertexOffset,pMesh,local_90,
                     currentPrimitive,&indices);
          sVar15 = sVar15 + 1;
        } while (sVar15 < numPoints);
        break;
      case Prim_LineStrip:
        numPoints = 2;
        sVar15 = 0;
        do {
          CopyVertex(this,sVar15,numOffsets,1,perVertexOffset,pMesh,local_90,currentPrimitive,
                     &indices);
          sVar15 = sVar15 + 1;
        } while (sVar15 < numPoints);
        break;
      case Prim_Triangles:
        numPoints = 3;
        sVar15 = 0;
        do {
          CopyVertex(this,sVar15,numOffsets,numPoints,perVertexOffset,pMesh,local_90,
                     currentPrimitive,&indices);
          sVar15 = sVar15 + 1;
        } while (sVar15 < numPoints);
        break;
      case Prim_TriStrips:
        numPoints = 3;
        ReadPrimTriStrips(this,numOffsets,perVertexOffset,pMesh,local_90,currentPrimitive,&indices);
        break;
      case Prim_TriFans:
      case Prim_Polygon:
        uVar16 = (long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        numPoints = uVar16 / numOffsets;
        if (numOffsets <= uVar16) {
          sVar15 = 0;
          do {
            CopyVertex(this,sVar15,numOffsets,numPoints,perVertexOffset,pMesh,local_90,
                       currentPrimitive,&indices);
            sVar15 = sVar15 + 1;
          } while (sVar15 < numPoints);
        }
        break;
      case Prim_Polylist:
        numPoints = (__range2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[currentPrimitive];
        if (numPoints != 0) {
          uVar16 = 0;
          do {
            CopyVertex(this,local_70 + uVar16,numOffsets,1,perVertexOffset,pMesh,local_90,0,&indices
                      );
            uVar16 = uVar16 + 1;
          } while (uVar16 < numPoints);
        }
        local_70 = local_70 + numPoints;
        break;
      default:
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"Unsupported primitive type.","");
        ThrowException(this,&local_60);
      }
      __position._M_current =
           (pMesh->mFaceSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pMesh->mFaceSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(local_38,__position,&numPoints);
      }
      else {
        *__position._M_current = numPoints;
        ppuVar1 = &(pMesh->mFaceSize).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      currentPrimitive = currentPrimitive + 1;
    } while (currentPrimitive != local_98);
  }
  TestClosing(this,"p");
  if (indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return local_98;
}

Assistant:

size_t ColladaParser::ReadPrimitives(Mesh* pMesh, std::vector<InputChannel>& pPerIndexChannels,
    size_t pNumPrimitives, const std::vector<size_t>& pVCount, PrimitiveType pPrimType)
{
    // determine number of indices coming per vertex
    // find the offset index for all per-vertex channels
    size_t numOffsets = 1;
    size_t perVertexOffset = SIZE_MAX; // invalid value
    for (const InputChannel& channel : pPerIndexChannels)
    {
        numOffsets = std::max(numOffsets, channel.mOffset + 1);
        if (channel.mType == IT_Vertex)
            perVertexOffset = channel.mOffset;
    }

    // determine the expected number of indices
    size_t expectedPointCount = 0;
    switch (pPrimType)
    {
    case Prim_Polylist:
    {
        for (size_t i : pVCount)
            expectedPointCount += i;
        break;
    }
    case Prim_Lines:
        expectedPointCount = 2 * pNumPrimitives;
        break;
    case Prim_Triangles:
        expectedPointCount = 3 * pNumPrimitives;
        break;
    default:
        // other primitive types don't state the index count upfront... we need to guess
        break;
    }

    // and read all indices into a temporary array
    std::vector<size_t> indices;
    if (expectedPointCount > 0)
        indices.reserve(expectedPointCount * numOffsets);

    if (pNumPrimitives > 0) // It is possible to not contain any indices
    {
        const char* content = GetTextContent();
        while (*content != 0)
        {
            // read a value.
            // Hack: (thom) Some exporters put negative indices sometimes. We just try to carry on anyways.
            int value = std::max(0, strtol10(content, &content));
            indices.push_back(size_t(value));
            // skip whitespace after it
            SkipSpacesAndLineEnd(&content);
        }
    }

    // complain if the index count doesn't fit
    if (expectedPointCount > 0 && indices.size() != expectedPointCount * numOffsets) {
        if (pPrimType == Prim_Lines) {
            // HACK: We just fix this number since SketchUp 15.3.331 writes the wrong 'count' for 'lines'
            ReportWarning("Expected different index count in <p> element, %zu instead of %zu.", indices.size(), expectedPointCount * numOffsets);
            pNumPrimitives = (indices.size() / numOffsets) / 2;
        }
        else
            ThrowException("Expected different index count in <p> element.");

    }
    else if (expectedPointCount == 0 && (indices.size() % numOffsets) != 0)
        ThrowException("Expected different index count in <p> element.");

    // find the data for all sources
    for (std::vector<InputChannel>::iterator it = pMesh->mPerVertexData.begin(); it != pMesh->mPerVertexData.end(); ++it)
    {
        InputChannel& input = *it;
        if (input.mResolved)
            continue;

        // find accessor
        input.mResolved = &ResolveLibraryReference(mAccessorLibrary, input.mAccessor);
        // resolve accessor's data pointer as well, if necessary
        const Accessor* acc = input.mResolved;
        if (!acc->mData)
            acc->mData = &ResolveLibraryReference(mDataLibrary, acc->mSource);
    }
    // and the same for the per-index channels
    for (std::vector<InputChannel>::iterator it = pPerIndexChannels.begin(); it != pPerIndexChannels.end(); ++it)
    {
        InputChannel& input = *it;
        if (input.mResolved)
            continue;

        // ignore vertex pointer, it doesn't refer to an accessor
        if (input.mType == IT_Vertex)
        {
            // warn if the vertex channel does not refer to the <vertices> element in the same mesh
            if (input.mAccessor != pMesh->mVertexID)
                ThrowException("Unsupported vertex referencing scheme.");
            continue;
        }

        // find accessor
        input.mResolved = &ResolveLibraryReference(mAccessorLibrary, input.mAccessor);
        // resolve accessor's data pointer as well, if necessary
        const Accessor* acc = input.mResolved;
        if (!acc->mData)
            acc->mData = &ResolveLibraryReference(mDataLibrary, acc->mSource);
    }

    // For continued primitives, the given count does not come all in one <p>, but only one primitive per <p>
    size_t numPrimitives = pNumPrimitives;
    if (pPrimType == Prim_TriFans || pPrimType == Prim_Polygon)
        numPrimitives = 1;
    // For continued primitives, the given count is actually the number of <p>'s inside the parent tag
    if (pPrimType == Prim_TriStrips) {
        size_t numberOfVertices = indices.size() / numOffsets;
        numPrimitives = numberOfVertices - 2;
    }
    if (pPrimType == Prim_LineStrip) {
        size_t numberOfVertices = indices.size() / numOffsets;
        numPrimitives = numberOfVertices - 1;
    }

    pMesh->mFaceSize.reserve(numPrimitives);
    pMesh->mFacePosIndices.reserve(indices.size() / numOffsets);

    size_t polylistStartVertex = 0;
    for (size_t currentPrimitive = 0; currentPrimitive < numPrimitives; currentPrimitive++)
    {
        // determine number of points for this primitive
        size_t numPoints = 0;
        switch (pPrimType)
        {
        case Prim_Lines:
            numPoints = 2;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, numPoints, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_LineStrip:
            numPoints = 2;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_Triangles:
            numPoints = 3;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, numPoints, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_TriStrips:
            numPoints = 3;
            ReadPrimTriStrips(numOffsets, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_Polylist:
            numPoints = pVCount[currentPrimitive];
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(polylistStartVertex + currentVertex, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, 0, indices);
            polylistStartVertex += numPoints;
            break;
        case Prim_TriFans:
        case Prim_Polygon:
            numPoints = indices.size() / numOffsets;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, numPoints, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        default:
            // LineStrip is not supported due to expected index unmangling
            ThrowException("Unsupported primitive type.");
            break;
        }

        // store the face size to later reconstruct the face from
        pMesh->mFaceSize.push_back(numPoints);
    }

    // if I ever get my hands on that guy who invented this steaming pile of indirection...
    TestClosing("p");
    return numPrimitives;
}